

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void biffnd(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort *puVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  runcxdef *prVar8;
  runsdef *prVar9;
  int iVar10;
  uint uVar11;
  dattyp typ;
  size_t __n;
  uint uVar12;
  ushort *puVar13;
  runsdef val;
  runsdef local_48;
  
  prVar8 = ctx->bifcxrun;
  uVar1 = prVar8->runcxsp[-1].runstyp;
  prVar9 = prVar8->runcxsp + -1;
  if (uVar1 == '\a') {
    prVar8->runcxsp = prVar9;
    prVar8 = ctx->bifcxrun;
    if (prVar9->runstyp != '\a') {
      prVar8->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3fc);
    }
    prVar9 = prVar8->runcxsp;
    puVar13 = (ushort *)(prVar9->runsv).runsvstr;
    uVar2 = *puVar13;
    prVar8->runcxsp = prVar9 + -1;
    local_48.runstyp = prVar9[-1].runstyp;
    local_48._1_7_ = *(undefined7 *)&prVar9[-1].field_0x1;
    local_48.runsv = prVar9[-1].runsv;
    typ = 5;
    iVar10 = uVar2 - 2;
    if (iVar10 == 0) {
      uVar11 = 1;
    }
    else {
      puVar13 = puVar13 + 1;
      uVar11 = 1;
      do {
        puVar4 = (ushort *)((long)puVar13 + 1);
        uVar6 = datsiz((uint)(byte)*puVar13,puVar4);
        if (local_48.runstyp == (byte)*puVar13) {
          switch(local_48.runstyp) {
          case '\x01':
            if ((ushort *)local_48.runsv.runsvnum != (ushort *)(long)*(int *)puVar4)
            goto LAB_00210cae;
            break;
          case '\x02':
          case '\n':
          case '\r':
            if (*puVar4 != local_48.runsv.runsvobj) goto LAB_00210cae;
            break;
          case '\x03':
          case '\a':
            if ((*puVar4 != *(ushort *)local_48.runsv.runsvstr) ||
               (iVar7 = bcmp((byte *)((long)puVar13 + 3),(ushort *)(local_48.runsv.runsvnum + 2),
                             (ulong)*puVar4 - 2), iVar7 != 0)) goto LAB_00210cae;
          }
          typ = 1;
          goto LAB_00210ce8;
        }
LAB_00210cae:
        uVar11 = uVar11 + 1;
        puVar13 = (ushort *)((long)puVar13 + (long)(int)(uVar6 + 1));
        iVar10 = iVar10 - (uVar6 + 1);
      } while (iVar10 != 0);
      typ = 5;
    }
LAB_00210ce8:
    local_48.runsv.runsvnum._4_4_ = 0;
    local_48.runsv.runsvnum._0_4_ = uVar11;
    runpush(ctx->bifcxrun,typ,&local_48);
    return;
  }
  if (uVar1 != '\x03') {
    prVar8->runcxerr->errcxptr->erraav[0].errastr = "find";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x3ff);
  }
  prVar8->runcxsp = prVar9;
  prVar8 = ctx->bifcxrun;
  if (prVar9->runstyp == '\x03') {
    prVar9 = prVar8->runcxsp;
    puVar13 = (ushort *)(prVar9->runsv).runsvstr;
    uVar2 = *puVar13;
    prVar8->runcxsp = prVar9 + -1;
    prVar8 = ctx->bifcxrun;
    if (prVar9[-1].runstyp == '\x03') {
      puVar4 = (ushort *)(prVar8->runcxsp->runsv).runsvstr;
      uVar3 = *puVar4;
      typ = 5;
      uVar12 = 1;
      uVar11 = uVar12;
      if (uVar3 <= uVar2) {
        __n = (ulong)uVar3 - 2;
        puVar13 = puVar13 + 1;
        iVar7 = (int)__n;
        uVar11 = (uint)uVar2 - iVar7;
        iVar10 = uVar2 - 1;
        do {
          iVar5 = bcmp(puVar13,puVar4 + 1,__n);
          if (iVar5 == 0) {
            typ = 1;
            uVar11 = uVar12;
            goto LAB_00210ce8;
          }
          puVar13 = (ushort *)((long)puVar13 + 1);
          uVar12 = uVar12 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar7 < iVar10);
        typ = 5;
      }
      goto LAB_00210ce8;
    }
  }
  prVar8->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3ef);
}

Assistant:

void biffnd(bifcxdef *ctx, int argc)
{
    uchar   *p1, *p2;
    int      len1, len2;
    int      outv;
    runsdef  val;
    int      typ;
    int      siz;
    
    bifcntargs(ctx, 2, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_SSTRING:
        p1 = runpopstr(ctx->bifcxrun);
        len1 = osrp2(p1) - 2;
        p1 += 2;
        
        p2 = runpopstr(ctx->bifcxrun);
        len2 = osrp2(p2) - 2;
        p2 += 2;

        /* look for p2 within p1 */
        for (typ = DAT_NIL, outv = 1 ; len1 >= len2 ; ++p1, --len1, ++outv)
        {
            if (!memcmp(p1, p2, (size_t)len2))
            {
                typ = DAT_NUMBER;           /* use number in outv after all */
                break;                        /* that's it - we've found it */
            }
        }
        break;
        
    case DAT_LIST:
        p1 = runpoplst(ctx->bifcxrun);
        len1 = osrp2(p1) - 2;
        p1 += 2;

        /* get second item:  any old datatype */
        runpop(ctx->bifcxrun, &val);
        
        for (typ = DAT_NIL, outv = 1 ; len1 ; ++outv, p1 += siz, len1 -= siz)
        {
            siz = datsiz(*p1, p1 + 1) + 1;      /* get size of this element */
            if (val.runstyp != *p1) continue;          /* types don't match */
            
            switch(val.runstyp)
            {
            case DAT_NUMBER:
                if (val.runsv.runsvnum != osrp4s(p1 + 1)) continue;
                break;
                
            case DAT_SSTRING:
            case DAT_LIST:
                if (osrp2(p1 + 1) != osrp2(val.runsv.runsvstr) ||
                    memcmp(p1 + 3, val.runsv.runsvstr + 2,
                           (size_t)(osrp2(p1 + 1) - 2)))
                    continue;
                break;
                
            case DAT_PROPNUM:
                if (osrp2(p1 + 1) != val.runsv.runsvprp) continue;
                break;
                
            case DAT_OBJECT:
            case DAT_FNADDR:
                if (osrp2(p1 + 1) != val.runsv.runsvobj) continue;
                break;
                
            default:
                break;
            }
            
            /* if we got here, it means we found a match */
            typ = DAT_NUMBER;                      /* use the value in outv */
            break;                            /* that's it - we've found it */
        }
        break;
        
    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "find");
    }
    
    /* push the value given by typ and outv */
    val.runsv.runsvnum = outv;
    runpush(ctx->bifcxrun, typ, &val);
}